

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall
Rml::DataInterpreter::ExtractArgumentsFromStack
          (DataInterpreter *this,Vector<Variant> *out_arguments)

{
  uint uVar1;
  vector<Rml::Variant,std::allocator<Rml::Variant>> *this_00;
  size_type sVar2;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  Variant *local_c8;
  Variant *local_c0;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  local_b8;
  Variant *local_b0;
  move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>_>
  local_a8;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  local_a0;
  const_iterator local_98;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  local_90;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  local_88;
  __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
  it_stack_begin_arguments;
  allocator<char> local_49;
  String local_48;
  uint local_24;
  vector<Rml::Variant,std::allocator<Rml::Variant>> *pvStack_20;
  int num_arguments;
  Vector<Variant> *out_arguments_local;
  DataInterpreter *this_local;
  
  pvStack_20 = (vector<Rml::Variant,std::allocator<Rml::Variant>> *)out_arguments;
  out_arguments_local = (Vector<Variant> *)this;
  local_24 = Variant::Get<int>(&this->R,-1);
  if ((int)local_24 < 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid number of arguments.",&local_49);
    this_local._7_1_ = Error(this,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::allocator<char>::~allocator(&local_49);
  }
  else {
    sVar2 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::size(&this->stack);
    uVar1 = local_24;
    if (sVar2 < (ulong)(long)(int)local_24) {
      sVar2 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::size(&this->stack);
      CreateString_abi_cxx11_
                ((String *)&it_stack_begin_arguments,
                 "Cannot pop %d arguments, stack contains only %zu elements.",(ulong)uVar1,sVar2);
      this_local._7_1_ = Error(this,(String *)&it_stack_begin_arguments);
      ::std::__cxx11::string::~string((string *)&it_stack_begin_arguments);
    }
    else {
      local_90._M_current =
           (Variant *)::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::end(&this->stack);
      local_88 = __gnu_cxx::
                 __normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
                 ::operator-(&local_90,(long)(int)local_24);
      this_00 = pvStack_20;
      local_a0._M_current =
           (Variant *)
           ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::end
                     ((vector<Rml::Variant,_std::allocator<Rml::Variant>_> *)pvStack_20);
      __gnu_cxx::
      __normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
      ::__normal_iterator<Rml::Variant*>
                ((__normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
                  *)&local_98,&local_a0);
      local_b0 = local_88._M_current;
      local_a8 = ::std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>>
                           (local_88);
      local_c0 = (Variant *)
                 ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::end(&this->stack);
      local_b8._M_current =
           (Variant *)
           ::std::
           make_move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>>
                     ((__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>
                       )local_c0);
      local_c8 = (Variant *)
                 ::std::vector<Rml::Variant,std::allocator<Rml::Variant>>::
                 insert<std::move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>>,void>
                           (this_00,local_98,local_a8,
                            (move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant_*,_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_>_>
                             )local_b8._M_current);
      __gnu_cxx::
      __normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
      ::__normal_iterator<Rml::Variant*>
                ((__normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
                  *)&local_d0,&local_88);
      local_e0._M_current =
           (Variant *)::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::end(&this->stack);
      __gnu_cxx::
      __normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
      ::__normal_iterator<Rml::Variant*>
                ((__normal_iterator<Rml::Variant_const*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>
                  *)&local_d8,&local_e0);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::erase
                (&this->stack,local_d0,local_d8);
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ExtractArgumentsFromStack(Vector<Variant>& out_arguments)
	{
		int num_arguments = R.Get<int>(-1);
		if (num_arguments < 0)
			return Error("Invalid number of arguments.");
		if (stack.size() < size_t(num_arguments))
			return Error(CreateString("Cannot pop %d arguments, stack contains only %zu elements.", num_arguments, stack.size()));

		const auto it_stack_begin_arguments = stack.end() - num_arguments;
		out_arguments.insert(out_arguments.end(), std::make_move_iterator(it_stack_begin_arguments), std::make_move_iterator(stack.end()));

		stack.erase(it_stack_begin_arguments, stack.end());
		return true;
	}